

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

ON_String * __thiscall ON_String::operator=(ON_String *this,ON_String *src)

{
  ON_aStringHeader *pOVar1;
  ON_String *src_local;
  ON_String *this_local;
  
  if (this->m_s != src->m_s) {
    pOVar1 = IncrementedHeader(src);
    if (pOVar1 == (ON_aStringHeader *)0x0) {
      Destroy(this);
      Create(this);
    }
    else {
      Destroy(this);
      this->m_s = src->m_s;
    }
  }
  return this;
}

Assistant:

ON_String& ON_String::operator=(const ON_String& src)
{
	if (m_s != src.m_s)	
  {
    if ( nullptr != src.IncrementedHeader() )
    {
      Destroy();
      m_s = src.m_s;
    }
    else
    {
      Destroy();
      Create();
    }
  }
	return *this;
}